

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O1

FileFlags __thiscall QFSFileEngine::fileFlags(QFSFileEngine *this,FileFlags type)

{
  QFSFileEnginePrivate *this_00;
  uint uVar1;
  QFlagsStorage<QAbstractFileEngine::FileFlag> QVar2;
  uint uVar3;
  bool bVar4;
  
  this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEngine).d_ptr.d;
  if (((uint)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
             super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i >> 0x18 & 1) != 0) {
    (this_00->metaData).knownFlagsMask.
    super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = 0;
  }
  uVar3 = ((uint)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
                 super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i & 0x7777) + 0x40070000;
  if (((uint)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
             super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i & 0xf0000) == 0) {
    uVar3 = (uint)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
                  super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i & 0x7777;
  }
  bVar4 = ((uint)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
                 super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i & 0xff00000) != 0;
  uVar1 = uVar3 + 0x500000;
  if (!bVar4) {
    uVar1 = uVar3;
  }
  QVar2.i = (uint)bVar4 << 0x15;
  bVar4 = QFSFileEnginePrivate::doStat(this_00,(MetaDataFlags)(uVar1 | 0x10000));
  if (bVar4) {
    if ((short)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
               super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i == 0) goto LAB_001741bb;
  }
  else {
    if (((this_00->metaData).entryFlags.
         super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
         super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x10000) == 0) {
      return (FileFlags)QVar2.i;
    }
    if ((short)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
               super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i == 0 || !bVar4)
    goto LAB_001741bb;
  }
  QVar2.i = QVar2.i | (this_00->metaData).entryFlags.
                      super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                      super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x7777;
LAB_001741bb:
  if (((uint)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
             super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i & 0xf0000) != 0) {
    if (((uint)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
               super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i >> 0x10 & 1) != 0) {
      QVar2.i = QVar2.i | (this_00->metaData).entryFlags.
                          super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                          super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x10000;
    }
    if (bVar4) {
      uVar3 = (this_00->metaData).entryFlags.
              super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
              super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
      if ((uVar3 >> 0x11 & 1) == 0) {
        QVar2.i = QVar2.i | uVar3 & 0x40000;
      }
      else {
        QVar2.i = QVar2.i | 0x20000;
      }
    }
  }
  if (((uint)type.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
             super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i & 0xff00000) != 0) {
    uVar3 = ~(this_00->metaData).entryFlags.
             super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i >> 8 & 0x400000 | QVar2.i;
    bVar4 = QFileSystemEntry::isRoot(&this_00->fileEntry);
    if (bVar4) {
      QVar2.i = uVar3 | 0x800000;
    }
    else {
      QVar2.i = (this_00->metaData).entryFlags.
                super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x100000 | uVar3;
    }
  }
  return (QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>)
         (QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>)QVar2.i;
}

Assistant:

QAbstractFileEngine::FileFlags QFSFileEngine::fileFlags(FileFlags type) const
{
    Q_D(const QFSFileEngine);

    if (type & Refresh)
        d->metaData.clear();

    QAbstractFileEngine::FileFlags ret = { };

    if (type & FlagsMask)
        ret |= LocalDiskFlag;

    bool exists;
    {
        QFileSystemMetaData::MetaDataFlags queryFlags = { };

        queryFlags |= QFileSystemMetaData::MetaDataFlags(uint(type.toInt()))
                & QFileSystemMetaData::Permissions;

        if (type & TypesMask)
            queryFlags |= QFileSystemMetaData::AliasType
                    | QFileSystemMetaData::LinkType
                    | QFileSystemMetaData::FileType
                    | QFileSystemMetaData::DirectoryType
                    | QFileSystemMetaData::BundleType
                    | QFileSystemMetaData::WasDeletedAttribute;

        if (type & FlagsMask)
            queryFlags |= QFileSystemMetaData::HiddenAttribute
                    | QFileSystemMetaData::ExistsAttribute;
        else if (type & ExistsFlag)
            queryFlags |= QFileSystemMetaData::WasDeletedAttribute;

        queryFlags |= QFileSystemMetaData::LinkType;

        exists = d->doStat(queryFlags);
    }

    if (!exists && !d->metaData.isLink())
        return ret;

    if (exists && (type & PermsMask))
        ret |= FileFlags(uint(d->metaData.permissions().toInt()));

    if (type & TypesMask) {
        if (d->metaData.isAlias()) {
            ret |= LinkType;
        } else {
            if ((type & LinkType) && d->metaData.isLink())
                ret |= LinkType;
            if (exists) {
                if (d->metaData.isFile()) {
                    ret |= FileType;
                } else if (d->metaData.isDirectory()) {
                    ret |= DirectoryType;
                    if ((type & BundleType) && d->metaData.isBundle())
                        ret |= BundleType;
                }
            }
        }
    }

    if (type & FlagsMask) {
        // the inode existing does not mean the file exists
        if (!d->metaData.wasDeleted())
            ret |= ExistsFlag;
        if (d->fileEntry.isRoot())
            ret |= RootFlag;
        else if (d->metaData.isHidden())
            ret |= HiddenFlag;
    }

    return ret;
}